

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphml.hpp
# Opt level: O3

void __thiscall
bal::GraphMLWeightedStreamWriter::write_header(GraphMLWeightedStreamWriter *this,Cnf *value)

{
  ostream *poVar1;
  
  GraphMLStreamWriter::write_header(&this->super_GraphMLStreamWriter,value);
  poVar1 = (this->super_GraphMLStreamWriter).super_StreamWriter<bal::Cnf>.stream_;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,
             "<key id=\"e_cardinality\" for=\"edge\" attr.name=\"cardinality\" attr.type=\"int\"/>",
             0x4c);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = (this->super_GraphMLStreamWriter).super_StreamWriter<bal::Cnf>.stream_;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"<key id=\"e_weight\" for=\"edge\" attr.name=\"weight\" attr.type=\"double\"/>",
             0x45);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

virtual void write_header(const Cnf& value) override {
            GraphMLStreamWriter::write_header(value);
            stream() << "<key id=\"e_cardinality\" for=\"edge\" attr.name=\"cardinality\" attr.type=\"int\"/>" << std::endl;
            stream() << "<key id=\"e_weight\" for=\"edge\" attr.name=\"weight\" attr.type=\"double\"/>" << std::endl;
        }